

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

ostream * lf::io::operator<<(ostream *stream,Format *f)

{
  undefined8 *puVar1;
  long lVar2;
  char *pcVar3;
  uint *local_38;
  undefined8 local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (*f == BINARY) {
    pcVar3 = "BINARY";
    lVar2 = 6;
  }
  else {
    if (*f != ASCII) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Unknown VtkFileFormat.","");
      *puVar1 = &PTR__LfException_00275d68;
      puVar1[1] = puVar1 + 3;
      if (local_38 == &local_28) {
        *(uint *)(puVar1 + 3) = local_28;
        *(undefined4 *)((long)puVar1 + 0x1c) = uStack_24;
        *(undefined4 *)(puVar1 + 4) = uStack_20;
        *(undefined4 *)((long)puVar1 + 0x24) = uStack_1c;
      }
      else {
        puVar1[1] = local_38;
        puVar1[3] = CONCAT44(uStack_24,local_28);
      }
      puVar1[2] = local_30;
      local_30 = 0;
      local_28 = local_28 & 0xffffff00;
      local_38 = &local_28;
      __cxa_throw(puVar1,&base::LfException::typeinfo,base::LfException::~LfException);
    }
    pcVar3 = "ASCII";
    lVar2 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,lVar2);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const VtkFile::Format& f) {
  switch (f) {
    case VtkFile::Format::ASCII:
      stream << "ASCII";
      break;
    case VtkFile::Format::BINARY:
      stream << "BINARY";
      break;
    default:
      throw base::LfException("Unknown VtkFileFormat.");
  }
  return stream;
}